

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_various.cpp
# Opt level: O0

void lsim::sim_register_various_functions(Simulator *sim)

{
  Simulator *pSVar1;
  anon_class_1_0_00000001 local_159;
  simulation_func_t local_158;
  anon_class_1_0_00000001 local_131;
  simulation_func_t local_130;
  anon_class_1_0_00000001 local_109;
  simulation_func_t local_108;
  anon_class_1_0_00000001 local_e1;
  simulation_func_t local_e0;
  anon_class_1_0_00000001 local_b9;
  simulation_func_t local_b8;
  anon_class_1_0_00000001 local_91;
  simulation_func_t local_90;
  anon_class_1_0_00000001 local_69;
  simulation_func_t local_68;
  anon_class_1_0_00000001 local_31;
  simulation_func_t local_30;
  Simulator *local_10;
  Simulator *sim_local;
  
  local_10 = sim;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_various_functions(lsim::Simulator*)::__0,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_30,&local_31);
  Simulator::register_sim_function(sim,1,0,&local_30);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_30);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_various_functions(lsim::Simulator*)::__1,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_68,&local_69);
  Simulator::register_sim_function(pSVar1,1,2,&local_68);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_68);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_various_functions(lsim::Simulator*)::__2,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_90,&local_91);
  Simulator::register_sim_function(pSVar1,3,0,&local_90);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_90);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_various_functions(lsim::Simulator*)::__3,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_b8,&local_b9);
  Simulator::register_sim_function(pSVar1,4,0,&local_b8);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_b8);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_various_functions(lsim::Simulator*)::__4,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_e0,&local_e1);
  Simulator::register_sim_function(pSVar1,0x21,0,&local_e0);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_e0);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_various_functions(lsim::Simulator*)::__5,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_108,&local_109);
  Simulator::register_sim_function(pSVar1,0x21,2,&local_108);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_108);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_various_functions(lsim::Simulator*)::__6,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_130,&local_131);
  Simulator::register_sim_function(pSVar1,0x101,0,&local_130);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_130);
  pSVar1 = local_10;
  std::function<void(lsim::Simulator*,lsim::SimComponent*)>::
  function<lsim::sim_register_various_functions(lsim::Simulator*)::__7,void>
            ((function<void(lsim::Simulator*,lsim::SimComponent*)> *)&local_158,&local_159);
  Simulator::register_sim_function(pSVar1,0x101,2,&local_158);
  std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::~function(&local_158);
  return;
}

Assistant:

void sim_register_various_functions(Simulator *sim) {
    SIM_SETUP_FUNC_BEGIN(CONNECTOR_IN) {
        if (!comp->user_values_enabled()) {
            return;
        }
        for (auto pin = 0u; pin < comp->num_outputs(); ++pin) {
            auto user_value = comp->user_value(comp->output_pin_index(pin));
            if (user_value != VALUE_UNDEFINED) {
                sim->pin_set_initial_value(comp->pin_by_index(pin), user_value);
                sim->pin_set_output_value(comp->pin_by_index(pin), user_value);
            }
        }

        // disable the independent simulation function until the user interacts with the connector
        sim->deactivate_independent_simulation_func(comp);
    } SIM_FUNC_END;

    SIM_INDEPENDENT_FUNC_BEGIN(CONNECTOR_IN) {
        for (auto pin = 0u; pin < comp->num_outputs(); ++pin) {
            auto last_value = sim->pin_output_value(comp->pin_by_index(comp->output_pin_index(pin)));
            auto user_value = comp->user_value(comp->output_pin_index(pin));
            if (last_value != user_value || user_value != VALUE_UNDEFINED) {
                comp->write_pin(pin, user_value);
            }
        }

        sim->deactivate_independent_simulation_func(comp);
    } SIM_FUNC_END;

    SIM_SETUP_FUNC_BEGIN(CONSTANT)  {
        auto value = comp->description()->property("value")->value_as_lsim_value();
        sim->pin_set_initial_value(comp->pin_by_index(0), value);
    } SIM_FUNC_END;

    SIM_SETUP_FUNC_BEGIN(PULL_RESISTOR) {
        auto value = comp->description()->property("pull_to")->value_as_lsim_value();
        sim->pin_set_default(comp->pin_by_index(0), value);
        sim->pin_set_initial_value(comp->pin_by_index(0), value);
    } SIM_FUNC_END;

    SIM_SETUP_FUNC_BEGIN(OSCILLATOR) {
        comp->set_extra_data_size(sizeof(ExtraDataOscillator));
        auto *extra = reinterpret_cast<ExtraDataOscillator *>(comp->extra_data());

        auto value = sim->pin_output_value(comp->pin_by_index(0));

        extra->m_duration[0] = comp->description()->property_value("low_duration", static_cast<int64_t>(1));
        extra->m_duration[1] = comp->description()->property_value("high_duration", static_cast<int64_t>(1));
        extra->m_next_change = sim->current_time() + extra->m_duration[value];
    } SIM_FUNC_END;

    SIM_INDEPENDENT_FUNC_BEGIN(OSCILLATOR) {
        auto *extra = reinterpret_cast<ExtraDataOscillator *>(comp->extra_data());
        if (sim->current_time() >= extra->m_next_change) {
            auto cur_value = sim->pin_output_value(comp->pin_by_index(0));
            auto new_value = cur_value == VALUE_TRUE ? VALUE_FALSE : VALUE_TRUE;
            
            extra->m_next_change = sim->current_time() + extra->m_duration[new_value];
            comp->write_pin(comp->output_pin_index(0), new_value);
        }
    } SIM_FUNC_END;

    SIM_SETUP_FUNC_BEGIN(7_SEGMENT_LED) {
        comp->set_extra_data_size(sizeof(ExtraData7SegmentLED));
    } SIM_FUNC_END;

    SIM_INDEPENDENT_FUNC_BEGIN(7_SEGMENT_LED) {
        auto *extra = reinterpret_cast<ExtraData7SegmentLED *>(comp->extra_data());
        auto led_on = comp->read_pin(comp->control_pin_index(0));

        if (led_on == VALUE_TRUE) {
            for (auto pin_idx = 0u; pin_idx < comp->num_inputs(); ++pin_idx) {
                extra->m_samples[pin_idx] += comp->read_pin(comp->input_pin_index(pin_idx)) == VALUE_TRUE ? 1: 0;
            }
        }
        extra->m_num_samples += 1;
    } SIM_FUNC_END;
}